

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.h
# Opt level: O0

TypeParameterSymbol * __thiscall
slang::ast::Scope::find<slang::ast::TypeParameterSymbol>(Scope *this,string_view name)

{
  Symbol *this_00;
  TypeParameterSymbol *pTVar1;
  Symbol *sym;
  Scope *this_local;
  string_view name_local;
  
  this_00 = find(this,name);
  if (this_00 == (Symbol *)0x0) {
    assert::assertFailed
              ("sym",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Scope.h"
               ,0x57,
               "const T &slang::ast::Scope::find(string_view) const [T = slang::ast::TypeParameterSymbol]"
              );
  }
  pTVar1 = Symbol::as<slang::ast::TypeParameterSymbol>(this_00);
  return pTVar1;
}

Assistant:

const T& find(string_view name) const {
        const Symbol* sym = find(name);
        ASSERT(sym);
        return sym->as<T>();
    }